

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O1

Value * __thiscall
soul::heart::AggregateInitialiserList::getAsConstant
          (Value *__return_storage_ptr__,AggregateInitialiserList *this)

{
  Category CVar1;
  size_t sVar2;
  bool bVar3;
  size_t index;
  long lVar4;
  Value result;
  Value v;
  Type local_110;
  uint64_t *local_f8;
  pool_ref<soul::heart::Expression> *local_f0;
  SubElementPath local_e8;
  Value local_b0;
  Value local_70;
  
  local_110.category = (this->type).category;
  local_110.arrayElementCategory = (this->type).arrayElementCategory;
  local_110.isRef = (this->type).isRef;
  local_110.isConstant = (this->type).isConstant;
  local_110.primitiveType.type = (this->type).primitiveType.type;
  local_110.boundingSize = (this->type).boundingSize;
  local_110.arrayElementBoundingSize = (this->type).arrayElementBoundingSize;
  local_110.structure.object = (this->type).structure.object;
  if (local_110.structure.object != (Structure *)0x0) {
    ((local_110.structure.object)->super_RefCountedObject).refCount =
         ((local_110.structure.object)->super_RefCountedObject).refCount + 1;
  }
  soul::Value::zeroInitialiser(&local_b0,&local_110);
  RefCountedPtr<soul::Structure>::decIfNotNull(local_110.structure.object);
  sVar2 = (this->items).numActive;
  if (sVar2 != 0) {
    local_f0 = (this->items).items;
    local_f8 = (__return_storage_ptr__->allocatedData).allocatedData.space;
    lVar4 = 0;
    index = 0;
    do {
      (**(code **)(**(long **)((long)&local_f0->object + lVar4) + 0x38))(&local_70);
      if (local_70.type.category == invalid) {
        (__return_storage_ptr__->type).structure.object = (Structure *)0x0;
        (__return_storage_ptr__->allocatedData).allocatedSize = 0;
        (__return_storage_ptr__->type).category = invalid;
        (__return_storage_ptr__->type).arrayElementCategory = invalid;
        (__return_storage_ptr__->type).isRef = false;
        (__return_storage_ptr__->type).isConstant = false;
        (__return_storage_ptr__->type).primitiveType = invalid;
        (__return_storage_ptr__->type).boundingSize = 0;
        (__return_storage_ptr__->type).arrayElementBoundingSize = 0;
        (__return_storage_ptr__->allocatedData).allocatedData.items = (uchar *)local_f8;
        (__return_storage_ptr__->allocatedData).allocatedData.numActive = 0;
        (__return_storage_ptr__->allocatedData).allocatedData.numAllocated = 8;
LAB_002449c0:
        bVar3 = false;
      }
      else {
        CVar1 = (this->type).category;
        if (CVar1 != structure) {
          if ((CVar1 != vector) && (CVar1 != array || (this->type).boundingSize == 0)) {
            soul::Value::castToTypeExpectingSuccess(__return_storage_ptr__,&local_70,&this->type);
            goto LAB_002449c0;
          }
        }
        SubElementPath::SubElementPath(&local_e8,index);
        soul::Value::modifySubElementInPlace(&local_b0,&local_e8,&local_70);
        local_e8.indexes.numActive = 0;
        if (4 < local_e8.indexes.numAllocated) {
          if (local_e8.indexes.items != (uint64_t *)0x0) {
            operator_delete__(local_e8.indexes.items);
          }
          local_e8.indexes.items = local_e8.indexes.space;
          local_e8.indexes.numAllocated = 4;
        }
        index = index + 1;
        bVar3 = true;
      }
      soul::Value::~Value(&local_70);
      if (!bVar3) goto LAB_00244a1e;
      lVar4 = lVar4 + 8;
    } while (sVar2 << 3 != lVar4);
  }
  (__return_storage_ptr__->type).category = local_b0.type.category;
  (__return_storage_ptr__->type).arrayElementCategory = local_b0.type.arrayElementCategory;
  (__return_storage_ptr__->type).isRef = local_b0.type.isRef;
  (__return_storage_ptr__->type).isConstant = local_b0.type.isConstant;
  (__return_storage_ptr__->type).primitiveType.type = local_b0.type.primitiveType.type;
  (__return_storage_ptr__->type).boundingSize = local_b0.type.boundingSize;
  (__return_storage_ptr__->type).arrayElementBoundingSize = local_b0.type.arrayElementBoundingSize;
  (__return_storage_ptr__->type).structure.object = local_b0.type.structure.object;
  local_b0.type.structure.object = (Structure *)0x0;
  (__return_storage_ptr__->allocatedData).allocatedSize = local_b0.allocatedData.allocatedSize;
  ArrayWithPreallocation<unsigned_char,_8UL>::ArrayWithPreallocation
            (&(__return_storage_ptr__->allocatedData).allocatedData,
             &local_b0.allocatedData.allocatedData);
LAB_00244a1e:
  soul::Value::~Value(&local_b0);
  return __return_storage_ptr__;
}

Assistant:

Value getAsConstant() const override
        {
            auto result = Value::zeroInitialiser (type);
            size_t index = 0;

            for (auto& i : items)
            {
                auto v = i->getAsConstant();

                if (! v.isValid())
                    return {};

                if (! (type.isStruct() || type.isFixedSizeArray() || type.isVector()))
                    return v.castToTypeExpectingSuccess (type);

                result.modifySubElementInPlace (index++, v);
            }

            return result;
        }